

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O0

void __thiscall QtMWidgets::BlurEffect::paintEvent(BlurEffect *this,QPaintEvent *param_1)

{
  QPainter local_20 [8];
  QPainter p;
  QPaintEvent *param_1_local;
  BlurEffect *this_local;
  
  _p = param_1;
  QPainter::QPainter(local_20,(QPaintDevice *)&this->field_0x10);
  QPainter::setRenderHint((RenderHint)local_20,true);
  switch(this->policy) {
  case BlurBothDirections:
    drawBlur(this,local_20,&this->color);
    break;
  case BlurHorizontalOnly:
    if (this->orientation == Vertical) {
      drawBlur(this,local_20,&this->color);
    }
    break;
  case BlurVerticalOnly:
    if (this->orientation == Horizontal) {
      drawBlur(this,local_20,&this->color);
    }
    break;
  case BlurAlwaysOff:
  }
  QPainter::~QPainter(local_20);
  return;
}

Assistant:

void
BlurEffect::paintEvent( QPaintEvent * )
{
	QPainter p( this );
	p.setRenderHint( QPainter::Antialiasing );

	switch( policy )
	{
		case AbstractScrollArea::BlurAlwaysOff :
			return;

		case AbstractScrollArea::BlurHorizontalOnly :
		{
			if( orientation == Qt::Vertical )
				drawBlur( &p, color );
		}
			break;

		case AbstractScrollArea::BlurVerticalOnly :
		{
			if( orientation == Qt::Horizontal )
				drawBlur( &p, color );
		}
			break;

		case AbstractScrollArea::BlurBothDirections :
			drawBlur( &p, color );
			break;

		default :
			break;
	}
}